

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O0

int xmlUCSIsCatPf(int code)

{
  undefined1 local_d;
  int code_local;
  
  local_d = true;
  if (((code != 0xbb) && (local_d = true, code != 0x2019)) && (local_d = true, code != 0x201d)) {
    local_d = code == 0x203a;
  }
  return (int)local_d;
}

Assistant:

int
xmlUCSIsCatPf(int code) {
    return((code == 0xbb) ||
           (code == 0x2019) ||
           (code == 0x201d) ||
           (code == 0x203a));
}